

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O2

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int64_t iVar7;
  ulong col;
  ulong col_00;
  int i;
  long lVar8;
  long lVar9;
  TPZVec<int> filtVecShape;
  TPZManVector<int,_11> first_hcurl_side;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  
  uVar3 = pztopology::TPZTetrahedron::NumSides(1);
  phi_unfilt.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = 0
  ;
  TPZManVector<int,_11>::TPZManVector(&first_hcurl_side,0xb,(int *)&phi_unfilt);
  iVar4 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                    (0,*(data->fHDivConnectOrders).super_TPZVec<int>.fStore);
  for (lVar8 = 1; lVar8 != 0xb; lVar8 = lVar8 + 1) {
    first_hcurl_side.super_TPZVec<int>.fStore[lVar8] = iVar4;
    iVar5 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                      ((int)lVar8,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar8]);
    iVar4 = iVar4 + iVar5;
  }
  TPZFMatrix<double>::TPZFMatrix(&phi_unfilt,3,(long)iVar4);
  TPZFMatrix<double>::TPZFMatrix(&curlphi_unfilt,3,(long)iVar4);
  TPZShapeHCurl<pzshape::TPZShapeTetra>::Shape(pt,data,&phi_unfilt,&curlphi_unfilt);
  col_00 = 0;
  col = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    col = col_00;
  }
  for (; col_00 != col; col_00 = col_00 + 1) {
    lVar8 = (long)first_hcurl_side.super_TPZVec<int>.fStore[col_00];
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()(&phi_unfilt,lVar9,lVar8);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(&phi_unfilt,lVar9,lVar8 + 1);
      dVar2 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(phi,lVar9,col_00);
      *pdVar6 = dVar1 + dVar2;
    }
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()(&curlphi_unfilt,lVar9,lVar8);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(&curlphi_unfilt,lVar9,lVar8 + 1);
      dVar2 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(curlphi,lVar9,col_00);
      *pdVar6 = dVar1 + dVar2;
    }
  }
  filtVecShape._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  filtVecShape.fStore = (int *)0x0;
  filtVecShape.fNElements = 0;
  filtVecShape.fNAlloc = 0;
  HighOrderFunctionsFilter
            (&first_hcurl_side.super_TPZVec<int>,&(data->fHDivConnectOrders).super_TPZVec<int>,
             &filtVecShape);
  lVar8 = 0;
  iVar7 = filtVecShape.fNElements;
  if (filtVecShape.fNElements < 1) {
    iVar7 = lVar8;
  }
  for (; lVar8 != iVar7; lVar8 = lVar8 + 1) {
    iVar4 = filtVecShape.fStore[lVar8];
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()(&curlphi_unfilt,lVar9,(long)iVar4);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(curlphi,lVar9,col);
      *pdVar6 = dVar1;
    }
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()(&phi_unfilt,lVar9,(long)iVar4);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()(phi,lVar9,col);
      *pdVar6 = dVar1;
    }
    col = col + 1;
  }
  TPZVec<int>::~TPZVec(&filtVecShape);
  TPZFMatrix<double>::~TPZFMatrix(&curlphi_unfilt);
  TPZFMatrix<double>::~TPZFMatrix(&phi_unfilt);
  TPZManVector<int,_11>::~TPZManVector(&first_hcurl_side);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}